

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O1

wchar_t pax_attribute_read_number(archive_read *a,size_t value_length,int64_t *result)

{
  wchar_t wVar1;
  int64_t iVar2;
  int64_t unconsumed;
  int64_t local_40;
  archive_string local_38;
  
  local_40 = 0;
  if (value_length < 0x41) {
    local_38.s = (char *)0x0;
    local_38.length = 0;
    local_38.buffer_length = 0;
    wVar1 = read_bytes_to_string(a,&local_38,value_length,&local_40);
    if (local_40 != 0) {
      __archive_read_consume(a,local_40);
      local_40 = 0;
    }
    if (wVar1 < L'\0') {
      archive_string_free(&local_38);
    }
    else {
      iVar2 = tar_atol_base_n(local_38.s,local_38.length,L'\n');
      *result = iVar2;
      archive_string_free(&local_38);
      wVar1 = L'\0';
      if (0x7ffffffffffffffe < (ulong)*result) {
        *result = 0x7fffffffffffffff;
        wVar1 = L'\xffffffec';
      }
    }
  }
  else {
    __archive_read_consume(a,value_length);
    *result = 0;
    wVar1 = L'\xffffffe2';
  }
  return wVar1;
}

Assistant:

static int
pax_attribute_read_number(struct archive_read *a, size_t value_length, int64_t *result) {
	struct archive_string as;
	int64_t unconsumed = 0;
	int r;

	if (value_length > 64) {
		__archive_read_consume(a, value_length);
		*result = 0;
		return (ARCHIVE_FATAL);
	}

	archive_string_init(&as);
	r = read_bytes_to_string(a, &as, value_length, &unconsumed);
	tar_flush_unconsumed(a, &unconsumed);
	if (r < ARCHIVE_OK) {
		archive_string_free(&as);
		return (r);
	}

	*result = tar_atol10(as.s, archive_strlen(&as));
	archive_string_free(&as);
	if (*result < 0 || *result == INT64_MAX) {
		*result = INT64_MAX;
		return (ARCHIVE_WARN);
	}
	return (ARCHIVE_OK);
}